

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O1

void __thiscall
phpconvert::ZendParser::buildFiles
          (ZendParser *this,File *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpOut,int *processed,
          vector<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
          *readerResult,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *tmpOutPairs,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmpVector)

{
  pointer pPVar1;
  long lVar2;
  Item *item;
  pointer pPVar3;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *__range2_1;
  vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
  *__range2;
  PreparedType type;
  File local_168;
  
  item = (readerResult->
         super__Vector_base<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
         )._M_impl.super__Vector_impl_data._M_start;
  if (item != (readerResult->
              super__Vector_base<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
              )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (item->isFile == true) {
        lVar2 = std::__cxx11::string::find((char *)&item->name,0x1311df,0);
        if (lVar2 != -1) {
          buildFile(&local_168,this,item,tmpOutPairs,tmpOut,tmpVector);
          std::__cxx11::string::_M_assign((string *)file);
          std::__cxx11::string::_M_assign((string *)&file->fullPath);
          std::__cxx11::string::_M_assign((string *)&file->rootPath);
          std::__cxx11::string::_M_assign((string *)&file->namespaceName);
          file->isValid = local_168.isValid;
          std::__cxx11::string::_M_assign((string *)&file->mainType);
          std::__cxx11::string::_M_assign((string *)&file->firstMainTypeFull);
          std::__cxx11::string::_M_assign((string *)&file->content);
          file->mainTypes = local_168.mainTypes;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&file->types,&local_168.types);
          std::
          vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
          ::operator=(&file->prepTypes,&local_168.prepTypes);
          std::
          vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
          ::operator=(&file->prepTypesMain,&local_168.prepTypesMain);
          BaseParser::File::~File(&local_168);
          *processed = *processed + 1;
          if (file->isValid != false) {
            std::__cxx11::string::_M_assign((string *)&file->rootPath);
            pPVar1 = (file->prepTypes).
                     super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pPVar3 = (file->prepTypes).
                          super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                          ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1;
                pPVar3 = pPVar3 + 1) {
              BaseParser::PreparedType::PreparedType((PreparedType *)&local_168,pPVar3);
              std::
              vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
              ::push_back(this->typesRegistryUnfiltered,(value_type *)&local_168);
              BaseParser::PreparedType::~PreparedType((PreparedType *)&local_168);
            }
            pPVar1 = (file->prepTypesMain).
                     super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pPVar3 = (file->prepTypesMain).
                          super__Vector_base<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
                          ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar1;
                pPVar3 = pPVar3 + 1) {
              BaseParser::PreparedType::PreparedType((PreparedType *)&local_168,pPVar3);
              std::
              vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
              ::push_back(this->typesRegistryUnfiltered,(value_type *)&local_168);
              BaseParser::PreparedType::~PreparedType((PreparedType *)&local_168);
            }
            std::vector<phpconvert::BaseParser::File,_std::allocator<phpconvert::BaseParser::File>_>
            ::push_back(this->results,file);
          }
        }
      }
      item = item + 1;
    } while (item != (readerResult->
                     super__Vector_base<phpconvert::DirectoryReader::Item,_std::allocator<phpconvert::DirectoryReader::Item>_>
                     )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void ZendParser::buildFiles(File file, vector<string> tmpOut, int &processed,
                                vector<DirectoryReader::Item> *readerResult,
                                vector<pair<string, string> > &tmpOutPairs,
                                vector<string> &tmpVector) {
        vector<DirectoryReader::Item>::iterator it;
        for (it = readerResult->begin(); it != readerResult->end(); ++it) {
            if (!it->isFile ||
                it->name.find(PHP_EXT) == string::npos) { //@todo find php3 and all possible native built in extensions
                continue;
            }

            file = buildFile(&(*it), tmpOutPairs, tmpOut, tmpVector);
            processed++;
            if (!file.isValid) {
                continue;
            }
            file.rootPath = it->dir;
            for (PreparedType type: file.prepTypes) {
                typesRegistryUnfiltered->push_back(type);
            }
            for (PreparedType type: file.prepTypesMain) {
                typesRegistryUnfiltered->push_back(type);
            }
            results->push_back(file);
        }
    }